

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
MeshEdgebreakerDecoderImpl
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this)

{
  (this->super_MeshEdgebreakerDecoderImplInterface)._vptr_MeshEdgebreakerDecoderImplInterface =
       (_func_int **)&PTR__MeshEdgebreakerDecoderImpl_00180310;
  (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  this->decoder_ = (MeshEdgebreakerDecoder *)0x0;
  (this->corner_table_)._M_t.
  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl = (CornerTable *)0x0;
  (this->corner_traversal_stack_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->corner_traversal_stack_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->corner_traversal_stack_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->topology_split_data_).
  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->topology_split_data_).
  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->topology_split_data_).
  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hole_event_data_).
  super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hole_event_data_).
  super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hole_event_data_).
  super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->hole_event_data_).
           super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->init_corners_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->init_corners_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->init_corners_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->last_symbol_id_ = -1;
  this->last_vert_id_ = -1;
  this->last_face_id_ = -1;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->visited_verts_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_verts_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->num_new_vertices_ = 0;
  (this->visited_verts_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  (this->visited_verts_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->visited_verts_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  (this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->new_to_parent_vertex_map_)._M_h._M_buckets =
       &(this->new_to_parent_vertex_map_)._M_h._M_single_bucket;
  (this->new_to_parent_vertex_map_)._M_h._M_bucket_count = 1;
  (this->new_to_parent_vertex_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->new_to_parent_vertex_map_)._M_h._M_element_count = 0;
  (this->new_to_parent_vertex_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->new_to_parent_vertex_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->new_to_parent_vertex_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->num_encoded_vertices_ = 0;
  (this->pos_encoding_data_).num_values = 0;
  (this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processed_connectivity_corners_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processed_connectivity_corners_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->processed_connectivity_corners_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->pos_data_decoder_id_ = -1;
  (this->attribute_data_).
  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attribute_data_).
  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attribute_data_).
  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  MeshEdgebreakerTraversalPredictiveDecoder::MeshEdgebreakerTraversalPredictiveDecoder
            (&this->traversal_decoder_);
  return;
}

Assistant:

MeshEdgebreakerDecoderImpl<TraversalDecoder>::MeshEdgebreakerDecoderImpl()
    : decoder_(nullptr),
      last_symbol_id_(-1),
      last_vert_id_(-1),
      last_face_id_(-1),
      num_new_vertices_(0),
      num_encoded_vertices_(0),
      pos_data_decoder_id_(-1) {}